

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O0

void __thiscall
amrex::STLtools::fillFab
          (STLtools *this,BaseFab<double> *levelset,Geometry *geom,RunOn param_4,Box *param_5)

{
  longdouble x;
  CoordSys *in_RDX;
  BaseFab<double> *in_RSI;
  long in_RDI;
  PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_> *this_00;
  Real RVar1;
  Real RVar2;
  Box *bx;
  Array4<double> *a;
  Real other_value;
  Real reference_value;
  XDim3 ptref;
  XDim3 ptmax;
  XDim3 ptmin;
  Triangle *tri_pts;
  GpuArray<double,_3U> dx;
  GpuArray<double,_3U> plo;
  int num_triangles;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  byte bVar3;
  Real local_348;
  anon_class_216_10_5f472846 *f;
  Box *box;
  Real local_2f8;
  undefined1 auStack_268 [64];
  Real local_228;
  Real local_220;
  Box *local_218;
  Array4<double> local_210;
  Array4<double> *local_1d0;
  Real local_1c8;
  Real local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  Triangle *local_160;
  GpuArray<double,_3U> local_158 [2];
  undefined4 local_124;
  CoordSys *local_110;
  BaseFab<double> *local_108;
  BaseFab<double> *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_124 = *(undefined4 *)(in_RDI + 0x48);
  local_110 = in_RDX;
  local_108 = in_RSI;
  Geometry::ProbLoArray((Geometry *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
  CoordSys::CellSizeArray(local_158,local_110);
  this_00 = (PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_> *)
            (in_RDI + 0x18);
  local_160 = PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::data
                        (this_00);
  local_168 = *(undefined8 *)(in_RDI + 0x60);
  local_178 = *(undefined8 *)(in_RDI + 0x50);
  uStack_170 = *(undefined8 *)(in_RDI + 0x58);
  local_188 = *(undefined8 *)(in_RDI + 0x78);
  local_198 = *(undefined8 *)(in_RDI + 0x68);
  uStack_190 = *(undefined8 *)(in_RDI + 0x70);
  local_1a8 = *(undefined8 *)(in_RDI + 0x90);
  local_1b8 = *(undefined8 *)(in_RDI + 0x80);
  uStack_1b0 = *(undefined8 *)(in_RDI + 0x88);
  bVar3 = *(byte *)(in_RDI + 0x98);
  x = (longdouble)1;
  RVar1 = literals::operator____rt((literals *)this_00,x);
  f = (anon_class_216_10_5f472846 *)0x8000000000000000;
  box = (Box *)0x8000000000000000;
  RVar2 = literals::operator____rt((literals *)this_00,x);
  local_2f8 = -RVar1;
  if ((bVar3 & 1) == 0) {
    local_2f8 = RVar2;
  }
  local_1c0 = local_2f8;
  bVar3 = *(byte *)(in_RDI + 0x98);
  local_348 = literals::operator____rt((literals *)this_00,x);
  RVar1 = literals::operator____rt((literals *)this_00,x);
  if ((bVar3 & 1) == 0) {
    local_348 = (Real)((ulong)RVar1 ^ (ulong)f);
  }
  local_1c8 = local_348;
  local_f8 = local_108;
  local_a8 = local_108->dptr;
  local_b0 = &local_108->domain;
  local_b4 = local_108->nvar;
  local_5c = 0;
  local_88 = (local_b0->smallend).vect[0];
  local_6c = 1;
  iStack_84 = (local_108->domain).smallend.vect[1];
  local_d0.x = (local_b0->smallend).vect[0];
  local_d0.y = (local_b0->smallend).vect[1];
  local_7c = 2;
  local_d0.z = (local_108->domain).smallend.vect[2];
  local_8 = &(local_108->domain).bigend;
  local_c = 0;
  local_38 = local_8->vect[0] + 1;
  local_18 = &(local_108->domain).bigend;
  local_1c = 1;
  iStack_34 = (local_108->domain).bigend.vect[1] + 1;
  local_28 = &(local_108->domain).bigend;
  local_2c = 2;
  local_f0.z = (local_108->domain).bigend.vect[2] + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_dc._0_8_ = local_f0._0_8_;
  local_dc.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<double>::Array4(&local_210,local_a8,&local_c0,&local_dc,local_b4);
  local_1d0 = &local_210;
  local_218 = BaseFab<double>::box(local_108);
  memcpy(auStack_268,local_1d0,0x3c);
  local_228 = local_1c0;
  local_220 = local_1c8;
  ParallelFor<amrex::STLtools::fillFab(amrex::BaseFab<double>&,amrex::Geometry_const&,amrex::RunOn,amrex::Box_const&)const::__0>
            (box,f);
  return;
}

Assistant:

void
STLtools::fillFab (BaseFab<Real>& levelset, const Geometry& geom, RunOn, Box const&) const
{
    int num_triangles = m_num_tri;

    const auto plo = geom.ProbLoArray();
    const auto dx  = geom.CellSizeArray();

    const Triangle* tri_pts = m_tri_pts_d.data();
    XDim3 ptmin = m_ptmin;
    XDim3 ptmax = m_ptmax;
    XDim3 ptref = m_ptref;
    Real reference_value = m_boundry_is_outside ? -1.0_rt :  1.0_rt;
    Real other_value     = m_boundry_is_outside ?  1.0_rt : -1.0_rt;

    auto const& a = levelset.array();
    const Box& bx = levelset.box();
    ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        Real coords[3];
        coords[0]=plo[0]+i*dx[0];
        coords[1]=plo[1]+j*dx[1];
#if (AMREX_SPACEDIM == 2)
        coords[2]=Real(0.);
#else
        coords[2]=plo[2]+k*dx[2];
#endif
        int num_intersects=0;
        if (coords[0] >= ptmin.x && coords[0] <= ptmax.x &&
            coords[1] >= ptmin.y && coords[1] <= ptmax.y &&
            coords[2] >= ptmin.z && coords[2] <= ptmax.z)
        {
            Real pr[]={ptref.x, ptref.y, ptref.z};
            for (int tr=0; tr < num_triangles; ++tr) {
                if (line_tri_intersects(pr, coords, tri_pts[tr])) {
                    ++num_intersects;
                }
            }
        }
        a(i,j,k) = (num_intersects % 2 == 0) ? reference_value : other_value;
    });
}